

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::WallyUtil::GetSupportedMnemonicLanguages_abi_cxx11_(void)

{
  CfdException *this;
  char *wally_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  allocator local_85;
  int ret;
  char *wally_lang;
  string lang;
  string local_58;
  string local_38;
  
  wally_lang = (char *)0x0;
  ret = bip39_get_languages(&wally_lang);
  if (ret == 0) {
    ConvertStringAndFree_abi_cxx11_(&lang,(WallyUtil *)wally_lang,wally_string);
    ::std::__cxx11::string::string((string *)&local_58,(string *)&lang);
    ::std::__cxx11::string::string((string *)&local_38," ",&local_85);
    StringUtil::Split(in_RDI,&local_58,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string((string *)&lang);
    return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI;
  }
  lang._M_dataplus._M_p = "cfdcore_wally_util.cpp";
  lang._M_string_length._0_4_ = 0x11e;
  lang.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_47c426;
  logger::warn<int&>((CfdSourceLocation *)&lang,"Get languages error. ret=[{}]",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&lang,"Get languages error.",(allocator *)&local_58);
  CfdException::CfdException(this,kCfdIllegalArgumentError,&lang);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<std::string> WallyUtil::GetSupportedMnemonicLanguages() {
  char* wally_lang = NULL;
  int ret = bip39_get_languages(&wally_lang);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Get languages error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Get languages error.");
  }

  // free and get string
  std::string lang = ConvertStringAndFree(wally_lang);
  return StringUtil::Split(std::string(lang), kMnemonicDelimiter);
}